

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

void __thiscall
wasm::StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::~TypeHierarchyPropagator
          (TypeHierarchyPropagator<wasm::LUBFinder> *this)

{
  TypeHierarchyPropagator<wasm::LUBFinder> *this_local;
  
  SubTypes::~SubTypes(&this->subTypes);
  return;
}

Assistant:

TypeHierarchyPropagator(Module& wasm) : subTypes(wasm) {}